

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceIndex
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  undefined4 uVar1;
  Analysis AVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t false_value;
  TypeManager *this;
  ConstantManager *this_00;
  FeatureManager *pFVar5;
  Instruction *pIVar6;
  Instruction *this_01;
  Instruction *this_02;
  Instruction *this_03;
  Instruction *this_04;
  uint32_t local_3dc;
  iterator local_3d8;
  undefined8 local_3d0;
  SmallVector<unsigned_int,_2UL> local_3c8;
  Operand local_3a0;
  uint32_t local_36c;
  iterator local_368;
  undefined8 local_360;
  SmallVector<unsigned_int,_2UL> local_358;
  Operand local_330;
  uint32_t local_2fc;
  iterator local_2f8;
  undefined8 local_2f0;
  SmallVector<unsigned_int,_2UL> local_2e8;
  Operand local_2c0;
  undefined1 local_290 [8];
  OperandList new_operands;
  Instruction *sel;
  Instruction *case_x;
  Instruction *case_y;
  Instruction *case_z;
  Instruction *y_gr_x;
  Instruction *is_z_max;
  uint32_t local_240;
  uint32_t local_23c;
  iterator local_238;
  size_type local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  Instruction *local_210;
  Instruction *amax_x_y;
  Instruction *is_x_neg;
  Instruction *is_y_neg;
  Instruction *is_z_neg;
  iterator local_1e8;
  size_type local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  Instruction *local_1c0;
  Instruction *az;
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  Instruction *local_188;
  Instruction *ay;
  iterator local_178;
  size_type local_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  Instruction *local_150;
  Instruction *ax;
  iterator local_140;
  size_type local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  Instruction *local_118;
  Instruction *z;
  iterator local_108;
  size_type local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  Instruction *local_e0;
  Instruction *y;
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  Instruction *local_a8;
  Instruction *x;
  uint32_t local_98;
  uint32_t f5_const_id;
  uint32_t f4_const_id;
  uint32_t f3_const_id;
  uint32_t f2_const_id;
  uint32_t f1_const_id;
  uint32_t f0_const_id;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t glsl405_ext_inst_id;
  uint32_t input_id;
  InstructionBuilder ir_builder;
  uint32_t bool_id;
  uint32_t float_type_id;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  this = IRContext::get_type_mgr(ctx);
  this_00 = IRContext::get_constant_mgr(ctx);
  ir_builder._28_4_ = analysis::TypeManager::GetFloatTypeId(this);
  ir_builder.preserved_analyses_ = analysis::TypeManager::GetBoolTypeId(this);
  AVar2 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)&glsl405_ext_inst_id,ctx,inst,AVar2);
  local_5c = opt::Instruction::GetSingleWordInOperand(inst,2);
  pFVar5 = IRContext::get_feature_mgr(ctx);
  local_60 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar5);
  if (local_60 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f0_const_id,"GLSL.std.450",(allocator<char> *)((long)&f1_const_id + 3));
    IRContext::AddExtInstImport(ctx,(string *)&f0_const_id);
    std::__cxx11::string::~string((string *)&f0_const_id);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f1_const_id + 3));
    pFVar5 = IRContext::get_feature_mgr(ctx);
    local_60 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar5);
  }
  f2_const_id = analysis::ConstantManager::GetFloatConstId(this_00,0.0);
  f3_const_id = analysis::ConstantManager::GetFloatConstId(this_00,1.0);
  f4_const_id = analysis::ConstantManager::GetFloatConstId(this_00,2.0);
  f5_const_id = analysis::ConstantManager::GetFloatConstId(this_00,3.0);
  local_98 = analysis::ConstantManager::GetFloatConstId(this_00,4.0);
  x._4_4_ = analysis::ConstantManager::GetFloatConstId(this_00,5.0);
  uVar1 = ir_builder._28_4_;
  uVar3 = local_5c;
  y._4_4_ = 0;
  local_d0 = (iterator)((long)&y + 4);
  local_c8 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&y + 3));
  __l_05._M_len = local_c8;
  __l_05._M_array = local_d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__l_05,(allocator_type *)((long)&y + 3));
  pIVar6 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,&local_c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&y + 3));
  uVar1 = ir_builder._28_4_;
  uVar3 = local_5c;
  z._4_4_ = 1;
  local_108 = (iterator)((long)&z + 4);
  local_100 = 1;
  local_a8 = pIVar6;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&z + 3));
  __l_04._M_len = local_100;
  __l_04._M_array = local_108;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_f8,__l_04,(allocator_type *)((long)&z + 3));
  pIVar6 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,&local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&z + 3));
  uVar1 = ir_builder._28_4_;
  uVar3 = local_5c;
  ax._4_4_ = 2;
  local_140 = (iterator)((long)&ax + 4);
  local_138 = 1;
  local_e0 = pIVar6;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&ax + 3));
  __l_03._M_len = local_138;
  __l_03._M_array = local_140;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_130,__l_03,(allocator_type *)((long)&ax + 3));
  pIVar6 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,&local_130);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&ax + 3));
  uVar1 = ir_builder._28_4_;
  uVar3 = local_60;
  local_118 = pIVar6;
  ay._4_4_ = opt::Instruction::result_id(local_a8);
  local_178 = (iterator)((long)&ay + 4);
  local_170 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&ay + 3));
  __l_02._M_len = local_170;
  __l_02._M_array = local_178;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_168,__l_02,(allocator_type *)((long)&ay + 3));
  pIVar6 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,4,&local_168);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_168);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&ay + 3));
  uVar1 = ir_builder._28_4_;
  uVar3 = local_60;
  local_150 = pIVar6;
  az._4_4_ = opt::Instruction::result_id(local_e0);
  local_1b0 = (iterator)((long)&az + 4);
  local_1a8 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&az + 3));
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1a0,__l_01,(allocator_type *)((long)&az + 3));
  pIVar6 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,4,&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&az + 3));
  uVar1 = ir_builder._28_4_;
  uVar3 = local_60;
  local_188 = pIVar6;
  is_z_neg._4_4_ = opt::Instruction::result_id(local_118);
  local_1e8 = (iterator)((long)&is_z_neg + 4);
  local_1e0 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&is_z_neg + 3));
  __l_00._M_len = local_1e0;
  __l_00._M_array = local_1e8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1d8,__l_00,(allocator_type *)((long)&is_z_neg + 3));
  pIVar6 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,4,&local_1d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&is_z_neg + 3));
  AVar2 = ir_builder.preserved_analyses_;
  local_1c0 = pIVar6;
  uVar3 = opt::Instruction::result_id(local_118);
  is_y_neg = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar2,OpFOrdLessThan,uVar3,
                        f2_const_id);
  AVar2 = ir_builder.preserved_analyses_;
  uVar3 = opt::Instruction::result_id(local_e0);
  is_x_neg = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar2,OpFOrdLessThan,uVar3,
                        f2_const_id);
  AVar2 = ir_builder.preserved_analyses_;
  uVar3 = opt::Instruction::result_id(local_a8);
  amax_x_y = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar2,OpFOrdLessThan,uVar3,
                        f2_const_id);
  uVar1 = ir_builder._28_4_;
  uVar3 = local_60;
  local_240 = opt::Instruction::result_id(local_150);
  local_23c = opt::Instruction::result_id(local_188);
  local_238 = &local_240;
  local_230 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&is_z_max + 7));
  __l._M_len = local_230;
  __l._M_array = local_238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_228,__l,(allocator_type *)((long)&is_z_max + 7));
  pIVar6 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,0x28,&local_228);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_228);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&is_z_max + 7));
  AVar2 = ir_builder.preserved_analyses_;
  local_210 = pIVar6;
  uVar3 = opt::Instruction::result_id(local_1c0);
  uVar4 = opt::Instruction::result_id(local_210);
  pIVar6 = InstructionBuilder::AddBinaryOp
                     ((InstructionBuilder *)&glsl405_ext_inst_id,AVar2,OpFOrdGreaterThanEqual,uVar3,
                      uVar4);
  AVar2 = ir_builder.preserved_analyses_;
  uVar3 = opt::Instruction::result_id(local_188);
  uVar4 = opt::Instruction::result_id(local_150);
  this_01 = InstructionBuilder::AddBinaryOp
                      ((InstructionBuilder *)&glsl405_ext_inst_id,AVar2,OpFOrdGreaterThanEqual,uVar3
                       ,uVar4);
  uVar1 = ir_builder._28_4_;
  uVar3 = opt::Instruction::result_id(is_y_neg);
  this_02 = InstructionBuilder::AddSelect
                      ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,x._4_4_,local_98);
  uVar1 = ir_builder._28_4_;
  uVar3 = opt::Instruction::result_id(is_x_neg);
  this_03 = InstructionBuilder::AddSelect
                      ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,f5_const_id,
                       f4_const_id);
  uVar1 = ir_builder._28_4_;
  uVar3 = opt::Instruction::result_id(amax_x_y);
  this_04 = InstructionBuilder::AddSelect
                      ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,f3_const_id,
                       f2_const_id);
  uVar1 = ir_builder._28_4_;
  uVar3 = opt::Instruction::result_id(this_01);
  uVar4 = opt::Instruction::result_id(this_03);
  false_value = opt::Instruction::result_id(this_04);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)InstructionBuilder::AddSelect
                          ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,uVar3,uVar4,false_value)
  ;
  opt::Instruction::SetOpcode(inst,OpSelect);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_290);
  local_2fc = opt::Instruction::result_id(pIVar6);
  local_2f8 = &local_2fc;
  local_2f0 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_2f8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2e8,init_list_01);
  Operand::Operand(&local_2c0,SPV_OPERAND_TYPE_ID,&local_2e8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_290,
             &local_2c0);
  Operand::~Operand(&local_2c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2e8);
  local_36c = opt::Instruction::result_id(this_02);
  local_368 = &local_36c;
  local_360 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_368;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_358,init_list_00);
  Operand::Operand(&local_330,SPV_OPERAND_TYPE_ID,&local_358);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_290,
             &local_330);
  Operand::~Operand(&local_330);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_358);
  local_3dc = opt::Instruction::result_id
                        ((Instruction *)
                         new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3d8 = &local_3dc;
  local_3d0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_3d8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3c8,init_list);
  Operand::Operand(&local_3a0,SPV_OPERAND_TYPE_ID,&local_3c8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_290,
             &local_3a0);
  Operand::~Operand(&local_3a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3c8);
  opt::Instruction::SetInOperands(inst,(OperandList *)local_290);
  IRContext::UpdateDefUse(ctx,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_290);
  return true;
}

Assistant:

bool ReplaceCubeFaceIndex(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f1_const_id = const_mgr->GetFloatConstId(1.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f3_const_id = const_mgr->GetFloatConstId(3.0);
  uint32_t f4_const_id = const_mgr->GetFloatConstId(4.0);
  uint32_t f5_const_id = const_mgr->GetFloatConstId(5.0);

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Get the absolute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Find the max value.
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());

  // Get the value for each case.
  Instruction* case_z = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), f5_const_id, f4_const_id);
  Instruction* case_y = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), f3_const_id, f2_const_id);
  Instruction* case_x = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), f1_const_id, f0_const_id);

  // Select the correct case.
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, y_gr_x->result_id(),
                           case_y->result_id(), case_x->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_z_max->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {case_z->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {sel->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}